

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int itype;
  ggml_context *ctx;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  uint uVar6;
  string fname_out;
  string fname_inp;
  allocator<char> local_6d;
  float local_6c;
  string local_68;
  string local_48;
  
  ggml_time_init();
  if (argc == 4) {
    ctx = ggml_init((ggml_init_params)ZEXT816(0));
    ggml_free(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,argv[1],(allocator<char> *)&local_68);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,argv[2],&local_6d);
    itype = atoi(argv[3]);
    iVar2 = ggml_time_us();
    iVar3 = ggml_time_us();
    bVar1 = llama_model_quantize(&local_48,&local_68,itype);
    if (!bVar1) {
      main_cold_2();
    }
    else {
      iVar4 = ggml_time_us();
      iVar5 = ggml_time_us();
      local_6c = (float)(iVar4 - iVar3);
      putchar(10);
      printf("%s: quantize time = %8.2f ms\n",(double)(local_6c / 1000.0),"main");
      printf("%s:    total time = %8.2f ms\n",(double)((float)(iVar5 - iVar2) / 1000.0),"main");
    }
    uVar6 = (uint)!bVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    main_cold_1();
    uVar6 = 1;
  }
  return uVar6;
}

Assistant:

int main(int argc, char ** argv) {
    ggml_time_init();
    if (argc != 4) {
        fprintf(stderr, "usage: %s model-f32.bin model-quant.bin type\n", argv[0]);
        fprintf(stderr, "  type = 2 - q4_0\n");
        fprintf(stderr, "  type = 3 - q4_1\n");
        return 1;
    }

    // needed to initialize f16 tables
    {
        struct ggml_init_params params = { 0, NULL };
        struct ggml_context * ctx = ggml_init(params);
        ggml_free(ctx);
    }

    const std::string fname_inp = argv[1];
    const std::string fname_out = argv[2];

    const int itype = atoi(argv[3]);

    const int64_t t_main_start_us = ggml_time_us();

    int64_t t_quantize_us = 0;

    // load the model
    {
        const int64_t t_start_us = ggml_time_us();

        if (!llama_model_quantize(fname_inp, fname_out, itype)) {
            fprintf(stderr, "%s: failed to quantize model from '%s'\n", __func__, fname_inp.c_str());
            return 1;
        }

        t_quantize_us = ggml_time_us() - t_start_us;
    }

    // report timing
    {
        const int64_t t_main_end_us = ggml_time_us();

        printf("\n");
        printf("%s: quantize time = %8.2f ms\n", __func__, t_quantize_us/1000.0f);
        printf("%s:    total time = %8.2f ms\n", __func__, (t_main_end_us - t_main_start_us)/1000.0f);
    }

    return 0;
}